

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionNlerp(Quaternion q1,Quaternion q2,float amount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Quaternion QVar6;
  
  fVar4 = amount * (q2.x - q1.x) + q1.x;
  fVar2 = (q2.y - q1.y) * amount + q1.y;
  fVar5 = amount * (q2.z - q1.z) + q1.z;
  fVar3 = (q2.w - q1.w) * amount + q1.w;
  fVar1 = fVar3 * fVar3 + fVar5 * fVar5 + fVar4 * fVar4 + fVar2 * fVar2;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = (float)(-(uint)(fVar1 == 0.0) & 0x3f800000 | ~-(uint)(fVar1 == 0.0) & (uint)(1.0 / fVar1))
  ;
  QVar6.y = fVar2 * fVar1;
  QVar6.x = fVar4 * fVar1;
  QVar6.w = fVar3 * fVar1;
  QVar6.z = fVar5 * fVar1;
  return QVar6;
}

Assistant:

RMAPI Quaternion QuaternionNlerp(Quaternion q1, Quaternion q2, float amount)
{
    Quaternion result = { 0 };

    // QuaternionLerp(q1, q2, amount)
    result.x = q1.x + amount*(q2.x - q1.x);
    result.y = q1.y + amount*(q2.y - q1.y);
    result.z = q1.z + amount*(q2.z - q1.z);
    result.w = q1.w + amount*(q2.w - q1.w);

    // QuaternionNormalize(q);
    Quaternion q = result;
    float length = sqrtf(q.x*q.x + q.y*q.y + q.z*q.z + q.w*q.w);
    if (length == 0.0f) length = 1.0f;
    float ilength = 1.0f/length;

    result.x = q.x*ilength;
    result.y = q.y*ilength;
    result.z = q.z*ilength;
    result.w = q.w*ilength;

    return result;
}